

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

void __thiscall
helics::CloningFilter::CloningFilter
          (CloningFilter *this,InterfaceVisibility locality,Federate *ffed,string_view filtName)

{
  bool bVar1;
  CloningFilter *pCVar2;
  undefined1 local_69;
  CloneFilterOperation *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<helics::FilterOperations> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Interface::Interface((Interface *)this,ffed,(InterfaceHandle)0x9aac0f00,filtName);
  (this->super_Filter).cloning = false;
  (this->super_Filter).disableAssign = false;
  (this->super_Filter).filtOp.
  super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Filter).filtOp.
  super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Filter_004db630;
  if (ffed != (Federate *)0x0) {
    if (locality == GLOBAL) {
      local_38 = 0;
      uStack_30 = 0;
      pCVar2 = Federate::registerGlobalCloningFilter
                         (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
      (this->super_Filter).super_Interface.handle.hid =
           (pCVar2->super_Filter).super_Interface.handle.hid;
      (this->super_Filter).super_Interface.mCore = (pCVar2->super_Filter).super_Interface.mCore;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->super_Filter).super_Interface.mName,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(pCVar2->super_Filter).super_Interface.mName);
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      pCVar2 = Federate::registerCloningFilter
                         (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
      (this->super_Filter).super_Interface.handle.hid =
           (pCVar2->super_Filter).super_Interface.handle.hid;
      (this->super_Filter).super_Interface.mCore = (pCVar2->super_Filter).super_Interface.mCore;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->super_Filter).super_Interface.mName,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(pCVar2->super_Filter).super_Interface.mName);
    }
    bVar1 = (pCVar2->super_Filter).disableAssign;
    (this->super_Filter).cloning = (pCVar2->super_Filter).cloning;
    (this->super_Filter).disableAssign = bVar1;
    (this->super_Filter).filtOp.
    super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pCVar2->super_Filter).filtOp.
         super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_Filter).filtOp.
                super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                &(pCVar2->super_Filter).filtOp.
                 super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    local_68 = (CloneFilterOperation *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::CloneFilterOperation,std::allocator<helics::CloneFilterOperation>>
              (&_Stack_60,&local_68,(allocator<helics::CloneFilterOperation> *)&local_69);
    local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_68->super_FilterOperations;
    local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_60._M_pi;
    local_68 = (CloneFilterOperation *)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(&this->super_Filter,&local_58);
    if (local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
  }
  return;
}

Assistant:

CloningFilter::CloningFilter(InterfaceVisibility locality,
                             Federate* ffed,
                             std::string_view filtName): Filter(ffed, filtName, InterfaceHandle())
{
    if (ffed != nullptr) {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(ffed->registerGlobalCloningFilter(filtName));
        } else {
            operator=(ffed->registerCloningFilter(filtName));
        }

        setFilterOperations(std::make_shared<CloneFilterOperation>());
    }
}